

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t len;
  ulong local_18;
  
  puVar2 = *p;
  local_18 = (long)end - (long)puVar2;
  if ((long)local_18 < 1) {
    return -0x2460;
  }
  if (*puVar2 == '\x18') {
    *p = puVar2 + 1;
    iVar1 = mbedtls_asn1_get_len(p,end,&local_18);
    if (iVar1 != 0) goto LAB_001a117f;
    time->year = 0;
    puVar2 = *p + 1;
    iVar5 = 0;
    iVar1 = -4;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->year = iVar5 * 10;
      *p = puVar2;
      iVar5 = iVar5 * 10 + (uint)puVar2[-1] + -0x30;
      time->year = iVar5;
      puVar2 = puVar2 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    time->mon = 0;
    iVar5 = 0;
    iVar1 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->mon = iVar5 * 10;
      *p = puVar2;
      iVar5 = iVar5 * 10 + (uint)puVar2[-1] + -0x30;
      time->mon = iVar5;
      puVar2 = puVar2 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    time->day = 0;
    iVar5 = 0;
    iVar1 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->day = iVar5 * 10;
      *p = puVar2;
      iVar5 = iVar5 * 10 + (uint)puVar2[-1] + -0x30;
      time->day = iVar5;
      puVar2 = puVar2 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    time->hour = 0;
    iVar5 = 0;
    iVar1 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->hour = iVar5 * 10;
      *p = puVar2;
      iVar5 = iVar5 * 10 + (uint)puVar2[-1] + -0x30;
      time->hour = iVar5;
      puVar2 = puVar2 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    time->min = 0;
    iVar5 = 0;
    iVar1 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->min = iVar5 * 10;
      *p = puVar2;
      iVar5 = iVar5 * 10 + (uint)puVar2[-1] + -0x30;
      time->min = iVar5;
      puVar2 = puVar2 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    if (0xc < local_18) {
      time->sec = 0;
      iVar5 = 0;
      iVar1 = -2;
      do {
        puVar3 = puVar2;
        if ((byte)(puVar3[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        time->sec = iVar5 * 10;
        *p = puVar3;
        iVar5 = iVar5 * 10 + (uint)puVar3[-1] + -0x30;
        time->sec = iVar5;
        iVar1 = iVar1 + 1;
        puVar2 = puVar3 + 1;
      } while (iVar1 != 0);
      if ((0xe < local_18) && (*p = puVar3 + 1, *puVar3 != 'Z')) {
        return -0x2400;
      }
    }
  }
  else {
    if (*puVar2 != '\x17') {
      return -0x2462;
    }
    *p = puVar2 + 1;
    iVar1 = mbedtls_asn1_get_len(p,end,&local_18);
    if (iVar1 != 0) {
LAB_001a117f:
      return iVar1 + -0x2400;
    }
    time->year = 0;
    puVar2 = *p + 1;
    iVar1 = 0;
    iVar5 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->year = iVar1 * 10;
      *p = puVar2;
      iVar4 = iVar1 * 10 + (uint)puVar2[-1];
      iVar1 = iVar4 + -0x30;
      time->year = iVar1;
      puVar2 = puVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    time->mon = 0;
    iVar6 = 0;
    iVar5 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->mon = iVar6 * 10;
      *p = puVar2;
      iVar6 = iVar6 * 10 + (uint)puVar2[-1] + -0x30;
      time->mon = iVar6;
      puVar2 = puVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    time->day = 0;
    iVar6 = 0;
    iVar5 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->day = iVar6 * 10;
      *p = puVar2;
      iVar6 = iVar6 * 10 + (uint)puVar2[-1] + -0x30;
      time->day = iVar6;
      puVar2 = puVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    time->hour = 0;
    iVar6 = 0;
    iVar5 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->hour = iVar6 * 10;
      *p = puVar2;
      iVar6 = iVar6 * 10 + (uint)puVar2[-1] + -0x30;
      time->hour = iVar6;
      puVar2 = puVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    time->min = 0;
    iVar6 = 0;
    iVar5 = -2;
    do {
      if ((byte)(puVar2[-1] - 0x3a) < 0xf6) {
        return -0x2400;
      }
      time->min = iVar6 * 10;
      *p = puVar2;
      iVar6 = iVar6 * 10 + (uint)puVar2[-1] + -0x30;
      time->min = iVar6;
      puVar2 = puVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    if (10 < local_18) {
      time->sec = 0;
      iVar6 = 0;
      iVar5 = -2;
      do {
        puVar3 = puVar2;
        if ((byte)(puVar3[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        time->sec = iVar6 * 10;
        *p = puVar3;
        iVar6 = iVar6 * 10 + (uint)puVar3[-1] + -0x30;
        time->sec = iVar6;
        iVar5 = iVar5 + 1;
        puVar2 = puVar3 + 1;
      } while (iVar5 != 0);
      if ((0xc < local_18) && (*p = puVar3 + 1, *puVar3 != 'Z')) {
        return -0x2400;
      }
    }
    iVar5 = iVar4 + 0x34;
    if (0x31 < iVar1) {
      iVar5 = iVar1;
    }
    time->year = iVar5 + 0x76c;
  }
  return 0;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 2, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 10 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 12 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        time->year +=  100 * ( time->year < 50 );
        time->year += 1900;

        return( 0 );
    }
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 4, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 12 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 14 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        return( 0 );
    }
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
}